

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O2

bool __thiscall MinVR::attribute::set_name(attribute *this,char *name)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    if ((int)sVar2 == 0) {
      bVar1 = false;
    }
    else {
      if (this->name_is_allocated == true) {
        free(this->m_name);
      }
      __dest = (char *)calloc(1,(long)(int)sVar2 + 1);
      this->m_name = __dest;
      strcpy(__dest,name);
      this->name_is_allocated = true;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool attribute::set_name(char* name)
{
    if(name != NULL)
    {
        int l;
        l = (int)strlen(name)*sizeof(char);
        if(l == 0)
            return false;
        if(name_is_allocated)
            free(m_name);
        m_name = (char*)malloc(l+sizeof(char));
        memset(m_name,'\0',l+sizeof(char));
        strcpy(m_name,name);
        name_is_allocated = true;
        return true;
    }
    return false;
}